

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

gene_t __thiscall Chromosome::get_allele(Chromosome *this,size_t gene,size_t bstart)

{
  _Base_bitset<1UL> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->ALLELE_SIZE);
  std::bitset<50ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<50ul> *)&local_38,&local_58,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  _Var1._M_w = local_38 << ((byte)bstart & 0x3f) & 0x3ffffffffffff;
  if (0x31 < bstart) {
    _Var1._M_w = 0;
  }
  _Var1._M_w = (_Var1._M_w &
               (this->genes).
               super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
               super__Vector_impl_data._M_start[gene].super__Base_bitset<1UL>._M_w) >>
               ((byte)bstart & 0x3f);
  if (0x31 < bstart) {
    _Var1._M_w = 0;
  }
  return (gene_t)_Var1._M_w;
}

Assistant:

Chromosome::gene_t Chromosome::get_allele( size_t gene, size_t bstart ) const
{
	gene_t tmp(std::string(ALLELE_SIZE, '1'));
	tmp <<= bstart;
	tmp &= genes[gene];
	tmp >>= bstart;

	return tmp;
}